

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_info_fwd.hpp
# Opt level: O0

error_info *
toml::make_error_info<char_const(&)[65]>
          (string *title,source_location *loc,string *msg,char (*tail) [65])

{
  error_info *in_RCX;
  error_info *in_RDX;
  error_info *in_RDI;
  error_info ei;
  source_location *in_stack_fffffffffffffdd8;
  source_location *in_stack_fffffffffffffde0;
  error_info *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe10;
  char *in_stack_fffffffffffffe18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe20;
  allocator<char> local_159 [105];
  string *in_stack_ffffffffffffff10;
  string *in_stack_ffffffffffffff18;
  source_location *in_stack_ffffffffffffff20;
  string *in_stack_ffffffffffffff28;
  error_info *in_stack_ffffffffffffff30;
  
  std::__cxx11::string::string(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  source_location::source_location(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  std::__cxx11::string::string(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
             (allocator<char> *)in_stack_fffffffffffffe10);
  error_info::error_info
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
             in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffde0);
  std::allocator<char>::~allocator(local_159);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffde0);
  source_location::~source_location(in_stack_fffffffffffffde0);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffde0);
  error_info::error_info(in_RCX,in_RDX);
  this = (error_info *)&stack0xfffffffffffffe17;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
             (allocator<char> *)in_stack_fffffffffffffe10);
  detail::make_error_info_rec(in_RDX,&in_RDI->title_);
  std::__cxx11::string::~string(&this->title_);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe17);
  error_info::~error_info(this);
  error_info::~error_info(this);
  return in_RDI;
}

Assistant:

error_info make_error_info(
    std::string title, source_location loc, std::string msg, Ts&& ... tail)
{
    error_info ei(std::move(title), std::move(loc), std::move(msg));
    return detail::make_error_info_rec(ei, std::forward<Ts>(tail) ... );
}